

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O1

__uint128_t * pstore::uint128::bytes_to_uint128(uint8_t *bytes)

{
  ulong uVar1;
  
  uVar1 = *(ulong *)(bytes + 8);
  return (__uint128_t *)
         (uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
}

Assistant:

constexpr __uint128_t uint128::bytes_to_uint128 (std::uint8_t const * const bytes) noexcept {
        return __uint128_t{bytes[0]} << 120U | __uint128_t{bytes[1]} << 112U |
               __uint128_t{bytes[2]} << 104U | __uint128_t{bytes[3]} << 96U |
               __uint128_t{bytes[4]} << 88U | __uint128_t{bytes[5]} << 80U |
               __uint128_t{bytes[6]} << 72U | __uint128_t{bytes[7]} << 64U |
               __uint128_t{bytes[8]} << 56U | __uint128_t{bytes[9]} << 48U |
               __uint128_t{bytes[10]} << 40U | __uint128_t{bytes[11]} << 32U |
               __uint128_t{bytes[12]} << 24U | __uint128_t{bytes[13]} << 16U |
               __uint128_t{bytes[14]} << 8U | __uint128_t{bytes[15]};
    }